

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O2

int __thiscall cppcms::http::impl::file_buffer::write_buffer(file_buffer *this)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int iVar3;
  void *__ptr;
  size_t __n;
  
  iVar3 = -1;
  if (this->closed_ == false) {
    __stream = (FILE *)this->f_;
    if (__stream == (FILE *)0x0) {
      get_name(this);
      __stream = fopen64((this->name_)._M_dataplus._M_p,"w+b");
      this->f_ = (FILE *)__stream;
      if (__stream == (FILE *)0x0) {
        return -1;
      }
    }
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      __ptr = *(void **)&this->field_0x20;
      __n = *(long *)&this->field_0x28 - (long)__ptr;
      if (__n != 0) {
        sVar2 = fwrite(__ptr,1,__n,(FILE *)this->f_);
        if (sVar2 != __n) {
          return -1;
        }
        __ptr = *(void **)&this->field_0x20;
      }
      this->file_size_ = this->file_size_ + __n;
      *(void **)&this->field_0x28 = __ptr;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int write_buffer()
	{
		if(closed_)
			return -1;
		if(!f_) {
			get_name();
			f_ = booster::nowide::fopen(name_.c_str(),"w+b");
			if(!f_)
				return -1;
		}
		if(fseek(f_,0,SEEK_END) !=0)
			return -1;
		size_t size = pptr()-pbase();
		if(size != 0 && fwrite(pbase(),1,size,f_)!=size)
			return -1;
		file_size_ += size;
		setp(pbase(),epptr());
		return 0;
	}